

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

bool embree::sse42::InstanceArrayIntersector1MB::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  ulong uVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  RTCFormat RVar4;
  InstanceArray *this;
  RTCRayQueryContext *pRVar5;
  RawBufferView *pRVar6;
  char *pcVar7;
  RawBufferView *pRVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  Accel *pAVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint auVar16 [1];
  uint auVar24 [1];
  undefined1 auVar18 [12];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar25;
  float fVar26;
  float fVar29;
  undefined1 in_XMM1 [16];
  vfloat4 a0;
  undefined1 auVar28 [16];
  undefined1 auVar30 [12];
  float fVar34;
  undefined1 in_XMM2 [16];
  undefined1 auVar31 [16];
  float fVar35;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_XMM3 [16];
  vfloat4 l02;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar45;
  undefined1 in_XMM4 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar43;
  undefined1 auVar44 [16];
  undefined1 auVar46 [12];
  undefined1 in_XMM5 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  undefined1 auVar55 [12];
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar62;
  undefined1 in_XMM7 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar64;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar63;
  undefined1 auVar61 [16];
  float fVar65;
  float fVar66;
  float fVar69;
  float fVar70;
  undefined1 in_XMM8 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar71;
  undefined1 in_XMM9 [16];
  undefined1 auVar72 [16];
  float fVar73;
  undefined1 in_XMM10 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar83 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 in_XMM14 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  float fVar93;
  RayQueryContext newcontext;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  float local_128;
  float local_118;
  float local_88;
  float fStack_84;
  float fStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  RTCRayQueryContext RVar17;
  undefined1 auVar27 [16];
  
  auVar46 = in_XMM5._0_12_;
  this = (InstanceArray *)(context->scene->geometries).items[prim->instID_].ptr;
  pAVar11 = InstanceArray::getObject(this,(ulong)prim->primID_);
  auVar55 = in_XMM7._0_12_;
  if (((pAVar11 == (Accel *)0x0) || ((ray->mask & (this->super_Geometry).mask) == 0)) ||
     (pRVar5 = context->user, pRVar5->instID[0] != 0xffffffff)) {
    bVar10 = false;
  }
  else {
    auVar16[0] = (*prim).primID_;
    auVar24[0] = (*prim).instID_;
    RVar17.instPrimID[0] = auVar16[0];
    RVar17.instID[0] = auVar24[0];
    auVar22._8_8_ = 0;
    auVar22._0_4_ = (float)auVar24[0];
    auVar22._4_4_ = (float)auVar16[0];
    *pRVar5 = RVar17;
    uVar12 = (ulong)prim->primID_;
    if ((this->super_Geometry).numTimeSteps == 1) {
      pRVar6 = (this->l2w_buf).items;
      RVar4 = pRVar6->format;
      if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
        if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = uVar12 * pRVar6->stride;
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x10),0x1c);
          in_XMM10 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x20),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 4)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x14),0x1c);
          in_XMM4 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x24),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 8)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x18),0x1c);
          in_XMM3 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x28),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x1c),0x1c);
          in_XMM2 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x2c),0x28);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = uVar12 * pRVar6->stride;
          in_XMM10._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 4);
          in_XMM10._0_4_ = *(undefined4 *)(pcVar7 + lVar13);
          in_XMM10._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 4) >> 0x20);
          in_XMM10._12_4_ = 0;
          in_XMM4._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x10);
          in_XMM4._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0xc);
          in_XMM4._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x10) >> 0x20);
          in_XMM4._12_4_ = 0;
          in_XMM3._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x1c);
          in_XMM3._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0x18);
          in_XMM3._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x1c) >> 0x20);
          in_XMM3._12_4_ = 0;
          in_XMM2._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x28);
          in_XMM2._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0x24);
          in_XMM2._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x28) >> 0x20);
          in_XMM2._12_4_ = 0;
        }
        else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = uVar12 * pRVar6->stride;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = *(ulong *)(pcVar7 + lVar13 + 0x10);
          auVar22 = insertps(auVar40,*(undefined4 *)(pcVar7 + lVar13 + 8),0x20);
          auVar74._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x34);
          auVar74._0_4_ = *(undefined4 *)(pcVar7 + lVar13);
          auVar74._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x34) >> 0x20);
          auVar74._12_4_ = 0;
          auVar33._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x1c);
          auVar33._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0x18);
          auVar33._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x1c) >> 0x20);
          auVar33._12_4_ = 0;
          fVar45 = *(float *)(pcVar7 + lVar13 + 0x24);
          fVar25 = *(float *)(pcVar7 + lVar13 + 0x28);
          fVar26 = *(float *)(pcVar7 + lVar13 + 0x2c);
          fVar29 = *(float *)(pcVar7 + lVar13 + 0x30);
          fVar65 = fVar29 * fVar29 + fVar26 * fVar26 + fVar45 * fVar45 + fVar25 * fVar25;
          auVar90 = rsqrtss(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65));
          fVar51 = auVar90._0_4_;
          auVar59._4_12_ = auVar90._4_12_;
          fVar51 = fVar51 * fVar51 * fVar65 * -0.5 * fVar51 + fVar51 * 1.5;
          in_XMM2 = insertps(auVar33,ZEXT416((uint)(fVar45 * fVar51)),0x30);
          in_XMM10 = insertps(auVar74,ZEXT416((uint)(fVar25 * fVar51)),0x30);
          auVar59._0_4_ = fVar51 * fVar29;
          auVar90 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar13 + 4),0x10);
          in_XMM3 = insertps(auVar22,auVar59,0x30);
          auVar22 = insertps(auVar90,*(undefined4 *)(pcVar7 + lVar13 + 0x3c),0x20);
          in_XMM4 = insertps(auVar22,ZEXT416((uint)(fVar26 * fVar51)),0x30);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = uVar12 * pRVar6->stride;
          in_XMM10 = *(undefined1 (*) [16])(pcVar7 + lVar13);
          in_XMM4 = *(undefined1 (*) [16])(pcVar7 + lVar13 + 0x10);
          in_XMM3 = *(undefined1 (*) [16])(pcVar7 + lVar13 + 0x20);
          in_XMM2 = *(undefined1 (*) [16])(pcVar7 + lVar13 + 0x30);
        }
        fVar65 = in_XMM2._8_4_;
        fVar45 = in_XMM2._12_4_;
        fVar35 = in_XMM10._12_4_;
        fVar34 = in_XMM4._4_4_;
        fVar29 = in_XMM4._12_4_;
        fVar80 = in_XMM3._8_4_;
        fVar26 = in_XMM3._12_4_;
        fVar73 = fVar35 * fVar29 + fVar26 * fVar45;
        fVar51 = fVar35 * fVar29 - fVar26 * fVar45;
        fVar53 = fVar45 * fVar45 + fVar35 * fVar35 + -fVar29 * fVar29 + -fVar26 * fVar26;
        fVar81 = fVar45 * fVar45 - fVar35 * fVar35;
        fVar71 = fVar29 * fVar29 + fVar81 + -fVar26 * fVar26;
        fVar62 = fVar35 * fVar26 - fVar29 * fVar45;
        fVar25 = fVar29 * fVar45 + fVar35 * fVar26;
        fVar64 = fVar29 * fVar26 + fVar35 * fVar45;
        fVar45 = fVar29 * fVar26 - fVar35 * fVar45;
        fVar73 = fVar73 + fVar73;
        fVar62 = fVar62 + fVar62;
        fVar66 = in_XMM10._0_4_;
        fVar35 = fVar26 * fVar26 + fVar81 + -fVar29 * fVar29;
        fVar54 = fVar53 * 1.0 + fVar73 * 0.0 + fVar62 * 0.0;
        fVar63 = fVar53 * 0.0 + fVar73 * 1.0 + fVar62 * 0.0;
        fVar52 = fVar53 * 0.0 + fVar73 * 0.0 + fVar62 * 1.0;
        fVar62 = fVar53 * 0.0 + fVar73 * 0.0 + fVar62 * 0.0;
        fVar64 = fVar64 + fVar64;
        fVar51 = fVar51 + fVar51;
        fVar53 = fVar51 * 1.0 + fVar71 * 0.0 + fVar64 * 0.0;
        fVar73 = fVar51 * 0.0 + fVar71 * 1.0 + fVar64 * 0.0;
        fVar81 = fVar51 * 0.0 + fVar71 * 0.0 + fVar64 * 1.0;
        fVar71 = fVar51 * 0.0 + fVar71 * 0.0 + fVar64 * 0.0;
        auVar67._0_8_ = in_XMM10._4_8_;
        auVar67._8_8_ = 0;
        auVar90 = blendps(auVar67,in_XMM4,4);
        fVar25 = fVar25 + fVar25;
        fVar45 = fVar45 + fVar45;
        fVar26 = fVar25 * 1.0 + fVar45 * 0.0 + fVar35 * 0.0;
        fVar29 = fVar25 * 0.0 + fVar45 * 1.0 + fVar35 * 0.0;
        fVar51 = fVar25 * 0.0 + fVar45 * 0.0 + fVar35 * 1.0;
        fVar25 = fVar25 * 0.0 + fVar45 * 0.0 + fVar35 * 0.0;
        fVar35 = fVar25 * 0.0;
        in_XMM14._0_4_ = fVar66 * fVar54 + fVar53 * 0.0 + fVar26 * 0.0;
        in_XMM14._4_4_ = fVar66 * fVar63 + fVar73 * 0.0 + fVar29 * 0.0;
        in_XMM14._8_4_ = fVar66 * fVar52 + fVar81 * 0.0 + fVar51 * 0.0;
        in_XMM14._12_4_ = fVar66 * fVar62 + fVar71 * 0.0 + fVar35;
        fVar45 = in_XMM4._0_4_;
        in_XMM1._0_4_ = fVar45 * fVar54 + fVar34 * fVar53 + fVar26 * 0.0;
        in_XMM1._4_4_ = fVar45 * fVar63 + fVar34 * fVar73 + fVar29 * 0.0;
        in_XMM1._8_4_ = fVar45 * fVar52 + fVar34 * fVar81 + fVar51 * 0.0;
        in_XMM1._12_4_ = fVar45 * fVar62 + fVar34 * fVar71 + fVar35;
        fVar34 = in_XMM3._4_4_;
        fVar45 = in_XMM3._0_4_;
        auVar22._0_4_ = fVar45 * fVar54 + fVar34 * fVar53 + fVar80 * fVar26;
        auVar22._4_4_ = fVar45 * fVar63 + fVar34 * fVar73 + fVar80 * fVar29;
        auVar22._8_4_ = fVar45 * fVar52 + fVar34 * fVar81 + fVar80 * fVar51;
        auVar22._12_4_ = fVar45 * fVar62 + fVar34 * fVar71 + fVar80 * fVar25;
        fVar25 = in_XMM2._4_4_;
        fVar45 = in_XMM2._0_4_;
        auVar46._0_4_ = fVar45 * fVar54 + fVar25 * fVar53 + fVar65 * fVar26 + auVar90._0_4_ + 0.0;
        auVar46._4_4_ = fVar45 * fVar63 + fVar25 * fVar73 + fVar65 * fVar29 + auVar90._4_4_ + 0.0;
        auVar46._8_4_ = fVar45 * fVar52 + fVar25 * fVar81 + fVar65 * fVar51 + auVar90._8_4_ + 0.0;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar13 = uVar12 * pRVar6->stride;
        auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13)),
                           *(undefined4 *)(pcVar7 + lVar13 + 0x10),0x1c);
        in_XMM14 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x20),0x28);
        auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 4)),
                           *(undefined4 *)(pcVar7 + lVar13 + 0x14),0x1c);
        in_XMM1 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x24),0x28);
        auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 8)),
                           *(undefined4 *)(pcVar7 + lVar13 + 0x18),0x1c);
        auVar22 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x28),0x28);
        auVar90 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 0xc)),
                           *(undefined4 *)(pcVar7 + lVar13 + 0x1c),0x1c);
        auVar90 = insertps(auVar90,*(undefined4 *)(pcVar7 + lVar13 + 0x2c),0x28);
        auVar46 = auVar90._0_12_;
      }
      else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar13 = uVar12 * pRVar6->stride;
        in_XMM14._4_4_ = (float)(int)*(undefined8 *)(pcVar7 + lVar13 + 4);
        in_XMM14._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar13);
        in_XMM14._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 4) >> 0x20);
        in_XMM14._12_4_ = 0.0;
        in_XMM1._4_4_ = (float)(int)*(undefined8 *)(pcVar7 + lVar13 + 0x10);
        in_XMM1._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar13 + 0xc);
        in_XMM1._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x10) >> 0x20);
        in_XMM1._12_4_ = 0.0;
        auVar22._4_4_ = (float)(int)*(undefined8 *)(pcVar7 + lVar13 + 0x1c);
        auVar22._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar13 + 0x18);
        auVar22._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x1c) >> 0x20);
        auVar22._12_4_ = 0.0;
        auVar46._4_4_ = (float)(int)*(undefined8 *)(pcVar7 + lVar13 + 0x28);
        auVar46._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar13 + 0x24);
        auVar46._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x28) >> 0x20);
      }
      else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar13 = uVar12 * pRVar6->stride;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)(pcVar7 + lVar13 + 0x10);
        auVar22 = insertps(auVar19,*(undefined4 *)(pcVar7 + lVar13 + 8),0x20);
        auVar88._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x34);
        auVar88._0_4_ = *(undefined4 *)(pcVar7 + lVar13);
        auVar88._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x34) >> 0x20);
        auVar88._12_4_ = 0;
        auVar47._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x1c);
        auVar47._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0x18);
        auVar47._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x1c) >> 0x20);
        auVar47._12_4_ = 0;
        fVar45 = *(float *)(pcVar7 + lVar13 + 0x24);
        fVar25 = *(float *)(pcVar7 + lVar13 + 0x28);
        fVar26 = *(float *)(pcVar7 + lVar13 + 0x2c);
        fVar29 = *(float *)(pcVar7 + lVar13 + 0x30);
        fVar65 = fVar29 * fVar29 + fVar26 * fVar26 + fVar45 * fVar45 + fVar25 * fVar25;
        auVar90 = rsqrtss(ZEXT416((uint)fVar65),ZEXT416((uint)fVar65));
        fVar51 = auVar90._0_4_;
        auVar56._4_12_ = auVar90._4_12_;
        fVar51 = fVar51 * fVar51 * fVar65 * -0.5 * fVar51 + fVar51 * 1.5;
        auVar90 = insertps(auVar47,ZEXT416((uint)(fVar45 * fVar51)),0x30);
        auVar46 = auVar90._0_12_;
        in_XMM14 = insertps(auVar88,ZEXT416((uint)(fVar25 * fVar51)),0x30);
        auVar56._0_4_ = fVar51 * fVar29;
        auVar90 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 0xc)),
                           *(undefined4 *)(pcVar7 + lVar13 + 4),0x10);
        auVar22 = insertps(auVar22,auVar56,0x30);
        auVar90 = insertps(auVar90,*(undefined4 *)(pcVar7 + lVar13 + 0x3c),0x20);
        in_XMM1 = insertps(auVar90,ZEXT416((uint)(fVar26 * fVar51)),0x30);
      }
      else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar7 = pRVar6->ptr_ofs;
        lVar13 = uVar12 * pRVar6->stride;
        in_XMM14 = *(undefined1 (*) [16])(pcVar7 + lVar13);
        in_XMM1 = *(undefined1 (*) [16])(pcVar7 + lVar13 + 0x10);
        auVar22 = *(undefined1 (*) [16])(pcVar7 + lVar13 + 0x20);
        auVar46 = SUB1612(*(undefined1 (*) [16])(pcVar7 + lVar13 + 0x30),0);
      }
    }
    else {
      fVar45 = (this->super_Geometry).fnumTimeSegments;
      fVar25 = (this->super_Geometry).time_range.lower;
      auVar30._0_4_ = (this->super_Geometry).time_range.upper - fVar25;
      auVar30._4_8_ = 0;
      fVar26 = (((ray->dir).field_0.m128[3] - fVar25) / auVar30._0_4_) * fVar45;
      auVar90 = roundss(ZEXT416((uint)fVar25),ZEXT416((uint)fVar26),9);
      fVar45 = fVar45 + -1.0;
      if (fVar45 <= auVar90._0_4_) {
        auVar90._0_4_ = fVar45;
      }
      auVar18 = ZEXT812(0);
      if (0.0 <= auVar90._0_4_) {
        auVar18._4_8_ = 0;
        auVar18._0_4_ = auVar90._0_4_;
      }
      auVar39._12_4_ = 0;
      auVar39._0_12_ = auVar18;
      uVar14 = (uint)auVar18._0_4_;
      fVar26 = fVar26 - auVar18._0_4_;
      pRVar8 = (this->l2w_buf).items;
      pRVar6 = pRVar8 + uVar14;
      RVar4 = pRVar8[uVar14].format;
      if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
        if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = pRVar6->stride * uVar12;
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x10),0x1c);
          _local_168 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x20),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 4)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x14),0x1c);
          _local_138 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x24),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 8)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x18),0x1c);
          _local_178 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x28),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x1c),0x1c);
          _local_148 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x2c),0x28);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = pRVar6->stride * uVar12;
          local_168._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 4);
          local_168._0_4_ = *(undefined4 *)(pcVar7 + lVar13);
          fStack_160 = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 4) >> 0x20);
          fStack_15c = 0.0;
          local_138._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x10);
          local_138._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0xc);
          fStack_130 = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x10) >> 0x20);
          fStack_12c = 0.0;
          local_178._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x1c);
          local_178._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0x18);
          fStack_170 = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x1c) >> 0x20);
          fStack_16c = 0.0;
          local_148._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x28);
          local_148._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0x24);
          fStack_140 = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x28) >> 0x20);
          fStack_13c = 0.0;
        }
        else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = pRVar6->stride * uVar12;
          auVar72._8_8_ = 0;
          auVar72._0_8_ = *(ulong *)(pcVar7 + lVar13 + 0x10);
          auVar90 = insertps(auVar72,*(undefined4 *)(pcVar7 + lVar13 + 8),0x20);
          auVar60._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x34);
          auVar60._0_4_ = *(undefined4 *)(pcVar7 + lVar13);
          auVar60._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x34) >> 0x20);
          auVar60._12_4_ = 0;
          auVar75._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x1c);
          auVar75._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0x18);
          auVar75._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x1c) >> 0x20);
          auVar75._12_4_ = 0;
          fVar45 = *(float *)(pcVar7 + lVar13 + 0x24);
          fVar25 = *(float *)(pcVar7 + lVar13 + 0x28);
          fVar29 = *(float *)(pcVar7 + lVar13 + 0x2c);
          fVar51 = *(float *)(pcVar7 + lVar13 + 0x30);
          fVar80 = fVar51 * fVar51 + fVar29 * fVar29 + fVar45 * fVar45 + fVar25 * fVar25;
          auVar22 = rsqrtss(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80));
          fVar65 = auVar22._0_4_;
          auVar78._4_12_ = auVar22._4_12_;
          fVar65 = fVar65 * fVar65 * fVar80 * -0.5 * fVar65 + fVar65 * 1.5;
          in_XMM10 = insertps(auVar75,ZEXT416((uint)(fVar45 * fVar65)),0x30);
          in_XMM7 = insertps(auVar60,ZEXT416((uint)(fVar25 * fVar65)),0x30);
          auVar78._0_4_ = fVar65 * fVar51;
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar13 + 4),0x10);
          in_XMM9 = insertps(auVar90,auVar78,0x30);
          auVar22 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x3c),0x20);
          in_XMM8 = insertps(auVar22,ZEXT416((uint)(fVar29 * fVar65)),0x30);
          _local_178 = in_XMM9;
          _local_168 = in_XMM7;
          _local_148 = in_XMM10;
          _local_138 = in_XMM8;
        }
        else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = pRVar6->stride * uVar12;
          _local_168 = *(undefined1 (*) [16])(pcVar7 + lVar13);
          _local_138 = *(undefined1 (*) [16])(pcVar7 + lVar13 + 0x10);
          _local_178 = *(undefined1 (*) [16])(pcVar7 + lVar13 + 0x20);
          _local_148 = *(undefined1 (*) [16])(pcVar7 + lVar13 + 0x30);
        }
        pRVar6 = pRVar8 + (uVar14 + 1);
        RVar4 = pRVar8[uVar14 + 1].format;
        if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = uVar12 * pRVar6->stride;
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x10),0x1c);
          in_XMM7 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x20),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 4)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x14),0x1c);
          in_XMM9 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x24),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 8)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x18),0x1c);
          in_XMM8 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x28),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x1c),0x1c);
          in_XMM10 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x2c),0x28);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = uVar12 * pRVar6->stride;
          in_XMM7._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 4);
          in_XMM7._0_4_ = *(undefined4 *)(pcVar7 + lVar13);
          in_XMM7._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 4) >> 0x20);
          in_XMM7._12_4_ = 0;
          in_XMM9._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x10);
          in_XMM9._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0xc);
          in_XMM9._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x10) >> 0x20);
          in_XMM9._12_4_ = 0;
          in_XMM8._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x1c);
          in_XMM8._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0x18);
          in_XMM8._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x1c) >> 0x20);
          in_XMM8._12_4_ = 0;
          in_XMM10._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x28);
          in_XMM10._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0x24);
          in_XMM10._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x28) >> 0x20);
          in_XMM10._12_4_ = 0;
        }
        else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = uVar12 * pRVar6->stride;
          auVar68._8_8_ = 0;
          auVar68._0_8_ = *(ulong *)(pcVar7 + lVar13 + 0x10);
          auVar90 = insertps(auVar68,*(undefined4 *)(pcVar7 + lVar13 + 8),0x20);
          auVar61._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x34);
          auVar61._0_4_ = *(undefined4 *)(pcVar7 + lVar13);
          auVar61._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x34) >> 0x20);
          auVar61._12_4_ = 0;
          auVar76._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x1c);
          auVar76._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0x18);
          auVar76._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x1c) >> 0x20);
          auVar76._12_4_ = 0;
          fVar45 = *(float *)(pcVar7 + lVar13 + 0x24);
          fVar25 = *(float *)(pcVar7 + lVar13 + 0x28);
          fVar29 = *(float *)(pcVar7 + lVar13 + 0x2c);
          fVar51 = *(float *)(pcVar7 + lVar13 + 0x30);
          fVar80 = fVar51 * fVar51 + fVar29 * fVar29 + fVar45 * fVar45 + fVar25 * fVar25;
          auVar22 = rsqrtss(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80));
          fVar65 = auVar22._0_4_;
          auVar44._4_12_ = auVar22._4_12_;
          fVar65 = fVar65 * fVar65 * fVar80 * -0.5 * fVar65 + fVar65 * 1.5;
          in_XMM10 = insertps(auVar76,ZEXT416((uint)(fVar45 * fVar65)),0x30);
          in_XMM7 = insertps(auVar61,ZEXT416((uint)(fVar25 * fVar65)),0x30);
          auVar44._0_4_ = fVar65 * fVar51;
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar13 + 4),0x10);
          in_XMM8 = insertps(auVar90,auVar44,0x30);
          auVar22 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x3c),0x20);
          in_XMM9 = insertps(auVar22,ZEXT416((uint)(fVar29 * fVar65)),0x30);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = uVar12 * pRVar6->stride;
          in_XMM7 = *(undefined1 (*) [16])(pcVar7 + lVar13);
          in_XMM9 = *(undefined1 (*) [16])(pcVar7 + lVar13 + 0x10);
          in_XMM8 = *(undefined1 (*) [16])(pcVar7 + lVar13 + 0x20);
          in_XMM10 = *(undefined1 (*) [16])(pcVar7 + lVar13 + 0x30);
        }
        local_128 = in_XMM10._12_4_;
        local_118 = in_XMM7._12_4_;
        fVar51 = in_XMM9._12_4_;
        fVar29 = in_XMM8._12_4_;
        fVar25 = fStack_16c * fVar29 +
                 fStack_12c * fVar51 + fStack_13c * local_128 + fStack_15c * local_118;
        fVar45 = -fVar25;
        if (fVar25 < fVar45) {
          local_128 = -local_128;
          local_118 = -local_118;
        }
        fVar80 = fVar45;
        fVar65 = -fVar29;
        if (fVar45 <= fVar25) {
          fVar80 = fVar25;
          fVar65 = fVar29;
        }
        fVar34 = ABS(fVar25);
        fVar29 = 1.0 - fVar34;
        if (fVar29 < 0.0) {
          fVar29 = sqrtf(fVar29);
        }
        else {
          fVar29 = SQRT(fVar29);
        }
        fVar35 = 1.5707964 -
                 fVar29 * (((((fVar34 * -0.0043095737 + 0.0192803) * fVar34 + -0.04489909) * fVar34
                            + 0.08785567) * fVar34 + -0.21450998) * fVar34 + 1.5707952);
        fVar29 = 0.0;
        if (0.0 <= fVar35) {
          fVar29 = fVar35;
        }
        fVar29 = (float)(-(uint)(1.0 < fVar34) & 0x7fc00000 |
                        ~-(uint)(1.0 < fVar34) &
                        (uint)(1.5707964 -
                              (float)((uint)-fVar29 & -(uint)(fVar80 < 0.0) |
                                     ~-(uint)(fVar80 < 0.0) & (uint)fVar29))) * fVar26;
        auVar22 = ZEXT416((uint)(fVar29 * 0.63661975));
        auVar22 = roundss(auVar22,auVar22,9);
        uVar15 = (uint)auVar22._0_4_;
        fVar29 = fVar29 - auVar22._0_4_ * 1.5707964;
        fVar34 = fVar29 * fVar29;
        local_188._0_4_ =
             (float)(~-(uint)(fVar25 < fVar45) & (uint)fVar51 |
                    (uint)-fVar51 & -(uint)(fVar25 < fVar45));
        uVar14 = uVar15 & 3;
        fVar25 = ((((fVar34 * -2.5963018e-07 + 2.4756235e-05) * fVar34 + -0.001388833) * fVar34 +
                  0.04166664) * fVar34 + -0.5) * fVar34 + 1.0;
        fVar29 = (((((fVar34 * -2.5029328e-08 + 2.7600126e-06) * fVar34 + -0.00019842605) * fVar34 +
                   0.008333348) * fVar34 + -0.16666667) * fVar34 + 1.0) * fVar29;
        fVar45 = fVar25;
        if ((uVar15 & 1) != 0) {
          fVar45 = fVar29;
          fVar29 = fVar25;
        }
        if (uVar14 - 1 < 2) {
          fVar45 = -fVar45;
        }
        fVar53 = fVar80 * fStack_13c - local_128;
        fVar35 = fVar80 * fStack_15c - local_118;
        fVar34 = fVar80 * fStack_12c - (float)local_188;
        fVar25 = fVar80 * fStack_16c - fVar65;
        auVar48._0_8_ = CONCAT44(fStack_16c,fVar25) ^ 0x8000000000000000;
        auVar48._8_4_ = -fStack_16c;
        auVar48._12_4_ = -fStack_16c;
        auVar49._4_12_ = auVar48._4_12_;
        auVar49._0_4_ = fVar25 * fVar25 + fVar34 * fVar34 + fVar53 * fVar53 + fVar35 * fVar35;
        auVar77._0_8_ = CONCAT44(fStack_16c,auVar49._0_4_) ^ 0x8000000000000000;
        auVar77._8_4_ = -fStack_16c;
        auVar77._12_4_ = -fStack_16c;
        auVar22 = rsqrtss(auVar77,auVar49);
        fVar73 = auVar22._0_4_;
        fVar73 = fVar73 * fVar73 * auVar49._0_4_ * -0.5 * fVar73 + fVar73 * 1.5;
        if (uVar14 < 2) {
          fVar29 = -fVar29;
        }
        fVar63 = 1.0 - fVar26;
        fVar54 = fVar63 * fStack_13c + local_128 * fVar26;
        fVar71 = fVar63 * fStack_15c + local_118 * fVar26;
        fVar81 = fVar63 * fStack_12c + (float)local_188 * fVar26;
        fVar62 = fStack_16c * fVar63 + fVar65 * fVar26;
        fVar52 = fVar62 * fVar62 + fVar81 * fVar81 + fVar54 * fVar54 + fVar71 * fVar71;
        auVar83._4_4_ = fStack_16c;
        auVar83._0_4_ = fVar52;
        auVar83._8_4_ = fStack_16c;
        auVar83._12_4_ = fStack_16c;
        auVar22 = rsqrtss(auVar83,auVar83);
        fVar65 = auVar22._0_4_;
        fVar65 = fVar65 * fVar65 * fVar52 * -0.5 * fVar65 + fVar65 * 1.5;
        if (0.9995 < fVar80) {
          fVar54 = fVar54 * fVar65;
          fVar71 = fVar71 * fVar65;
          fVar81 = fVar81 * fVar65;
        }
        else {
          fVar54 = fStack_13c * fVar45 + fVar53 * fVar73 * fVar29;
          fVar71 = fStack_15c * fVar45 + fVar35 * fVar73 * fVar29;
          fVar81 = fStack_12c * fVar45 + fVar34 * fVar73 * fVar29;
        }
        fVar29 = (float)(-(uint)(0.9995 < fVar80) & (uint)(fVar62 * fVar65) |
                        ~-(uint)(0.9995 < fVar80) &
                        (uint)(fVar45 * fStack_16c + fVar25 * fVar73 * fVar29));
        local_58 = in_XMM7._0_4_;
        fStack_54 = in_XMM7._4_4_;
        fStack_50 = in_XMM7._8_4_;
        fVar87 = (float)local_168._0_4_ * fVar63 + local_58 * fVar26;
        local_78 = in_XMM9._0_4_;
        fStack_74 = in_XMM9._4_4_;
        fStack_70 = in_XMM9._8_4_;
        fVar92 = (float)local_138._0_4_ * fVar63 + local_78 * fVar26;
        fVar93 = (float)local_138._4_4_ * fVar63 + fStack_74 * fVar26;
        local_68 = in_XMM8._0_4_;
        fStack_64 = in_XMM8._4_4_;
        fStack_60 = in_XMM8._8_4_;
        fVar73 = (float)local_178._0_4_ * fVar63 + local_68 * fVar26;
        fVar62 = (float)local_178._4_4_ * fVar63 + fStack_64 * fVar26;
        fVar64 = fStack_170 * fVar63 + fStack_60 * fVar26;
        local_88 = in_XMM10._0_4_;
        fStack_84 = in_XMM10._4_4_;
        fStack_80 = in_XMM10._8_4_;
        fVar84 = fVar63 * (float)local_148._0_4_ + fVar26 * local_88;
        fVar85 = fVar63 * (float)local_148._4_4_ + fVar26 * fStack_84;
        fVar86 = fVar63 * fStack_140 + fVar26 * fStack_80;
        fVar80 = fVar54 * fVar54 + fVar71 * fVar71 + -fVar81 * fVar81 + -fVar29 * fVar29;
        fVar69 = fVar71 * fVar81 + fVar54 * fVar29;
        fVar52 = fVar71 * fVar81 - fVar54 * fVar29;
        fVar65 = fVar54 * fVar54 - fVar71 * fVar71;
        fVar70 = fVar81 * fVar81 + fVar65 + -fVar29 * fVar29;
        fVar82 = fVar71 * fVar29 - fVar54 * fVar81;
        fVar25 = fVar54 * fVar81 + fVar71 * fVar29;
        fVar66 = fVar81 * fVar29 + fVar54 * fVar71;
        fVar45 = fVar81 * fVar29 - fVar54 * fVar71;
        fVar69 = fVar69 + fVar69;
        fVar82 = fVar82 + fVar82;
        fVar65 = fVar29 * fVar29 + fVar65 + -fVar81 * fVar81;
        fVar34 = fVar80 * 1.0 + fVar69 * 0.0 + fVar82 * 0.0;
        fVar35 = fVar80 * 0.0 + fVar69 * 1.0 + fVar82 * 0.0;
        fVar53 = fVar80 * 0.0 + fVar69 * 0.0 + fVar82 * 1.0;
        fVar80 = fVar80 * 0.0 + fVar69 * 0.0 + fVar82 * 0.0;
        fVar66 = fVar66 + fVar66;
        fVar52 = fVar52 + fVar52;
        fVar81 = fVar52 * 1.0 + fVar70 * 0.0 + fVar66 * 0.0;
        fVar71 = fVar52 * 0.0 + fVar70 * 1.0 + fVar66 * 0.0;
        fVar54 = fVar52 * 0.0 + fVar70 * 0.0 + fVar66 * 1.0;
        fVar52 = fVar52 * 0.0 + fVar70 * 0.0 + fVar66 * 0.0;
        auVar50._4_4_ = fStack_160 * fVar63 + fStack_50 * fVar26;
        auVar50._0_4_ = (float)local_168._4_4_ * fVar63 + fStack_54 * fVar26;
        auVar50._8_8_ = 0;
        auVar9._4_4_ = fVar93;
        auVar9._0_4_ = fVar92;
        auVar9._8_4_ = fStack_130 * fVar63 + fStack_70 * fVar26;
        auVar9._12_4_ = fStack_12c * fVar63 + fVar51 * fVar26;
        auVar90 = blendps(auVar50,auVar9,4);
        fVar25 = fVar25 + fVar25;
        fVar45 = fVar45 + fVar45;
        fVar26 = fVar25 * 1.0 + fVar45 * 0.0 + fVar65 * 0.0;
        fVar29 = fVar25 * 0.0 + fVar45 * 1.0 + fVar65 * 0.0;
        fVar51 = fVar25 * 0.0 + fVar45 * 0.0 + fVar65 * 1.0;
        fVar45 = fVar25 * 0.0 + fVar45 * 0.0 + fVar65 * 0.0;
        fVar25 = fVar45 * 0.0;
        in_XMM14._0_4_ = fVar87 * fVar34 + fVar81 * 0.0 + fVar26 * 0.0;
        in_XMM14._4_4_ = fVar87 * fVar35 + fVar71 * 0.0 + fVar29 * 0.0;
        in_XMM14._8_4_ = fVar87 * fVar53 + fVar54 * 0.0 + fVar51 * 0.0;
        in_XMM14._12_4_ = fVar87 * fVar80 + fVar52 * 0.0 + fVar25;
        in_XMM1._0_4_ = fVar92 * fVar34 + fVar93 * fVar81 + fVar26 * 0.0;
        in_XMM1._4_4_ = fVar92 * fVar35 + fVar93 * fVar71 + fVar29 * 0.0;
        in_XMM1._8_4_ = fVar92 * fVar53 + fVar93 * fVar54 + fVar51 * 0.0;
        in_XMM1._12_4_ = fVar92 * fVar80 + fVar93 * fVar52 + fVar25;
        auVar22._0_4_ = fVar73 * fVar34 + fVar62 * fVar81 + fVar64 * fVar26;
        auVar22._4_4_ = fVar73 * fVar35 + fVar62 * fVar71 + fVar64 * fVar29;
        auVar22._8_4_ = fVar73 * fVar53 + fVar62 * fVar54 + fVar64 * fVar51;
        auVar22._12_4_ = fVar73 * fVar80 + fVar62 * fVar52 + fVar64 * fVar45;
        auVar46._0_4_ = fVar84 * fVar34 + fVar85 * fVar81 + fVar86 * fVar26 + auVar90._0_4_ + 0.0;
        auVar46._4_4_ = fVar84 * fVar35 + fVar85 * fVar71 + fVar86 * fVar29 + auVar90._4_4_ + 0.0;
        auVar46._8_4_ = fVar84 * fVar53 + fVar85 * fVar54 + fVar86 * fVar51 + auVar90._8_4_ + 0.0;
      }
      else {
        if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = pRVar6->stride * uVar12;
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x10),0x1c);
          in_XMM14 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x20),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 4)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x14),0x1c);
          auVar90 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x24),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 8)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x18),0x1c);
          auVar39 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x28),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x1c),0x1c);
          auVar22 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x2c),0x28);
          auVar30 = auVar22._0_12_;
        }
        else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = pRVar6->stride * uVar12;
          in_XMM14._4_4_ = (float)(int)*(undefined8 *)(pcVar7 + lVar13 + 4);
          in_XMM14._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar13);
          in_XMM14._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 4) >> 0x20);
          in_XMM14._12_4_ = 0.0;
          auVar90._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x10);
          auVar90._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0xc);
          auVar90._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x10) >> 0x20);
          auVar90._12_4_ = 0;
          auVar39._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x1c);
          auVar39._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0x18);
          auVar39._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x1c) >> 0x20);
          auVar39._12_4_ = 0;
          uVar1 = *(ulong *)(pcVar7 + lVar13 + 0x28);
          in_XMM3._8_8_ = 0;
          in_XMM3._0_8_ = uVar1;
          auVar30._4_4_ = (int)uVar1;
          auVar30._0_4_ = (float)*(undefined4 *)(pcVar7 + lVar13 + 0x24);
          auVar30._8_4_ = (int)(uVar1 >> 0x20);
        }
        else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = pRVar6->stride * uVar12;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = *(ulong *)(pcVar7 + lVar13 + 0x10);
          auVar22 = insertps(auVar20,*(undefined4 *)(pcVar7 + lVar13 + 8),0x20);
          auVar89._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x34);
          auVar89._0_4_ = *(undefined4 *)(pcVar7 + lVar13);
          auVar89._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x34) >> 0x20);
          auVar89._12_4_ = 0;
          auVar31._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x1c);
          auVar31._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0x18);
          auVar31._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x1c) >> 0x20);
          auVar31._12_4_ = 0;
          fVar45 = *(float *)(pcVar7 + lVar13 + 0x24);
          fVar25 = *(float *)(pcVar7 + lVar13 + 0x28);
          fVar29 = *(float *)(pcVar7 + lVar13 + 0x2c);
          fVar51 = *(float *)(pcVar7 + lVar13 + 0x30);
          in_XMM4 = ZEXT416((uint)fVar51);
          fVar80 = fVar51 * fVar51 + fVar29 * fVar29 + fVar45 * fVar45 + fVar25 * fVar25;
          auVar90 = rsqrtss(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80));
          fVar65 = auVar90._0_4_;
          auVar57._4_12_ = auVar90._4_12_;
          fVar65 = fVar65 * fVar65 * fVar80 * -0.5 * fVar65 + fVar65 * 1.5;
          in_XMM6 = ZEXT416((uint)(fVar45 * fVar65));
          auVar90 = insertps(auVar31,in_XMM6,0x30);
          auVar30 = auVar90._0_12_;
          in_XMM14 = insertps(auVar89,ZEXT416((uint)(fVar25 * fVar65)),0x30);
          in_XMM3 = ZEXT416((uint)(fVar29 * fVar65));
          auVar57._0_4_ = fVar65 * fVar51;
          auVar55 = auVar57._0_12_;
          auVar90 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar13 + 4),0x10);
          auVar39 = insertps(auVar22,auVar57,0x30);
          auVar22 = insertps(auVar90,*(undefined4 *)(pcVar7 + lVar13 + 0x3c),0x20);
          auVar90 = insertps(auVar22,in_XMM3,0x30);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = pRVar6->stride * uVar12;
          in_XMM14 = *(undefined1 (*) [16])(pcVar7 + lVar13);
          auVar90 = *(undefined1 (*) [16])(pcVar7 + lVar13 + 0x10);
          auVar39 = *(undefined1 (*) [16])(pcVar7 + lVar13 + 0x20);
          auVar30 = SUB1612(*(undefined1 (*) [16])(pcVar7 + lVar13 + 0x30),0);
        }
        pRVar6 = pRVar8 + (uVar14 + 1);
        RVar4 = pRVar8[uVar14 + 1].format;
        if (RVar4 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = uVar12 * pRVar6->stride;
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x10),0x1c);
          in_XMM4 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x20),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 4)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x14),0x1c);
          in_XMM6 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x24),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 8)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x18),0x1c);
          in_XMM3 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x28),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar13 + 0x1c),0x1c);
          auVar22 = insertps(auVar22,*(undefined4 *)(pcVar7 + lVar13 + 0x2c),0x28);
          auVar55 = auVar22._0_12_;
        }
        else if (RVar4 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = uVar12 * pRVar6->stride;
          in_XMM4._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 4);
          in_XMM4._0_4_ = *(undefined4 *)(pcVar7 + lVar13);
          in_XMM4._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 4) >> 0x20);
          in_XMM4._12_4_ = 0;
          in_XMM6._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x10);
          in_XMM6._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0xc);
          in_XMM6._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x10) >> 0x20);
          in_XMM6._12_4_ = 0;
          in_XMM3._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x1c);
          in_XMM3._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0x18);
          in_XMM3._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x1c) >> 0x20);
          in_XMM3._12_4_ = 0;
          auVar55._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x28);
          auVar55._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0x24);
          auVar55._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x28) >> 0x20);
        }
        else if (RVar4 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = uVar12 * pRVar6->stride;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = *(ulong *)(pcVar7 + lVar13 + 0x10);
          auVar22 = insertps(auVar36,*(undefined4 *)(pcVar7 + lVar13 + 8),0x20);
          auVar41._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x34);
          auVar41._0_4_ = *(undefined4 *)(pcVar7 + lVar13);
          auVar41._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x34) >> 0x20);
          auVar41._12_4_ = 0;
          auVar58._4_4_ = (int)*(undefined8 *)(pcVar7 + lVar13 + 0x1c);
          auVar58._0_4_ = *(undefined4 *)(pcVar7 + lVar13 + 0x18);
          auVar58._8_4_ = (int)((ulong)*(undefined8 *)(pcVar7 + lVar13 + 0x1c) >> 0x20);
          auVar58._12_4_ = 0;
          fVar45 = *(float *)(pcVar7 + lVar13 + 0x24);
          fVar25 = *(float *)(pcVar7 + lVar13 + 0x28);
          fVar29 = *(float *)(pcVar7 + lVar13 + 0x2c);
          fVar51 = *(float *)(pcVar7 + lVar13 + 0x30);
          fVar80 = fVar51 * fVar51 + fVar29 * fVar29 + fVar45 * fVar45 + fVar25 * fVar25;
          auVar78 = rsqrtss(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80));
          fVar65 = auVar78._0_4_;
          auVar79._4_12_ = auVar78._4_12_;
          fVar65 = fVar65 * fVar65 * fVar80 * -0.5 * fVar65 + fVar65 * 1.5;
          auVar78 = insertps(auVar58,ZEXT416((uint)(fVar45 * fVar65)),0x30);
          auVar55 = auVar78._0_12_;
          in_XMM4 = insertps(auVar41,ZEXT416((uint)(fVar25 * fVar65)),0x30);
          auVar79._0_4_ = fVar65 * fVar51;
          auVar78 = insertps(ZEXT416(*(uint *)(pcVar7 + lVar13 + 0xc)),
                             *(undefined4 *)(pcVar7 + lVar13 + 4),0x10);
          in_XMM3 = insertps(auVar22,auVar79,0x30);
          auVar22 = insertps(auVar78,*(undefined4 *)(pcVar7 + lVar13 + 0x3c),0x20);
          in_XMM6 = insertps(auVar22,ZEXT416((uint)(fVar29 * fVar65)),0x30);
        }
        else if (RVar4 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar7 = pRVar6->ptr_ofs;
          lVar13 = uVar12 * pRVar6->stride;
          in_XMM4 = *(undefined1 (*) [16])(pcVar7 + lVar13);
          in_XMM6 = *(undefined1 (*) [16])(pcVar7 + lVar13 + 0x10);
          in_XMM3 = *(undefined1 (*) [16])(pcVar7 + lVar13 + 0x20);
          auVar55 = SUB1612(*(undefined1 (*) [16])(pcVar7 + lVar13 + 0x30),0);
        }
        fVar45 = 1.0 - fVar26;
        fVar25 = in_XMM14._4_4_;
        fVar29 = in_XMM14._8_4_;
        fVar51 = in_XMM14._12_4_;
        in_XMM14._0_4_ = in_XMM14._0_4_ * fVar45 + in_XMM4._0_4_ * fVar26;
        in_XMM14._4_4_ = fVar25 * fVar45 + in_XMM4._4_4_ * fVar26;
        in_XMM14._8_4_ = fVar29 * fVar45 + in_XMM4._8_4_ * fVar26;
        in_XMM14._12_4_ = fVar51 * fVar45 + in_XMM4._12_4_ * fVar26;
        in_XMM1._0_4_ = auVar90._0_4_ * fVar45 + in_XMM6._0_4_ * fVar26;
        in_XMM1._4_4_ = auVar90._4_4_ * fVar45 + in_XMM6._4_4_ * fVar26;
        in_XMM1._8_4_ = auVar90._8_4_ * fVar45 + in_XMM6._8_4_ * fVar26;
        in_XMM1._12_4_ = auVar90._12_4_ * fVar45 + in_XMM6._12_4_ * fVar26;
        auVar22._0_4_ = auVar39._0_4_ * fVar45 + in_XMM3._0_4_ * fVar26;
        auVar22._4_4_ = auVar39._4_4_ * fVar45 + in_XMM3._4_4_ * fVar26;
        auVar22._8_4_ = auVar39._8_4_ * fVar45 + in_XMM3._8_4_ * fVar26;
        auVar22._12_4_ = auVar39._12_4_ * fVar45 + in_XMM3._12_4_ * fVar26;
        auVar46._0_4_ = fVar45 * auVar30._0_4_ + fVar26 * auVar55._0_4_;
        auVar46._4_4_ = fVar45 * auVar30._4_4_ + fVar26 * auVar55._4_4_;
        auVar46._8_4_ = fVar45 * auVar30._8_4_ + fVar26 * auVar55._8_4_;
      }
    }
    fVar45 = auVar22._0_4_;
    fVar25 = auVar22._4_4_;
    fVar26 = auVar22._8_4_;
    fVar29 = auVar22._12_4_;
    fVar51 = in_XMM1._0_4_;
    fVar65 = in_XMM1._4_4_;
    fVar80 = in_XMM1._8_4_;
    auVar32._0_4_ = fVar51 * fVar25 - fVar45 * fVar65;
    fVar34 = fVar65 * fVar26 - fVar25 * fVar80;
    fVar35 = fVar80 * fVar45 - fVar26 * fVar51;
    auVar37._4_4_ = fVar35;
    auVar37._0_4_ = fVar34;
    auVar37._8_4_ = auVar32._0_4_;
    auVar37._12_4_ = in_XMM1._12_4_ * fVar29 - fVar29 * in_XMM1._12_4_;
    fVar53 = in_XMM14._0_4_;
    fVar73 = in_XMM14._4_4_;
    fVar81 = in_XMM14._8_4_;
    auVar21._0_4_ = fVar45 * fVar73 - fVar25 * fVar53;
    auVar21._4_4_ = fVar25 * fVar81 - fVar26 * fVar73;
    auVar21._8_4_ = fVar26 * fVar53 - fVar45 * fVar81;
    auVar21._12_4_ = fVar29 * in_XMM14._12_4_ - fVar29 * in_XMM14._12_4_;
    fVar45 = fVar80 * fVar73 - fVar81 * fVar65;
    auVar90 = dpps(in_XMM14,auVar37,0x7f);
    auVar28._4_4_ = fVar45;
    auVar28._0_4_ = fVar34;
    auVar22 = insertps(auVar21,auVar21,0x4a);
    auVar32._4_4_ = auVar21._0_4_;
    auVar32._8_4_ = fVar65 * fVar53 - fVar73 * fVar51;
    auVar32._12_4_ = 0;
    auVar28._8_4_ = fVar45;
    auVar28._12_4_ = auVar22._4_4_;
    auVar27._8_8_ = auVar28._8_8_;
    auVar27._4_4_ = auVar22._0_4_;
    auVar27._0_4_ = fVar34;
    auVar38._4_4_ = auVar22._8_4_;
    auVar38._0_4_ = fVar35;
    auVar38._8_4_ = fVar51 * fVar81 - fVar53 * fVar80;
    auVar38._12_4_ = auVar22._12_4_;
    auVar91._0_4_ = auVar90._0_4_;
    auVar91._4_4_ = auVar91._0_4_;
    auVar91._8_4_ = auVar91._0_4_;
    auVar91._12_4_ = auVar91._0_4_;
    auVar22 = divps(auVar27,auVar91);
    auVar39 = divps(auVar38,auVar91);
    auVar90 = divps(auVar32,auVar91);
    fVar71 = auVar46._0_4_;
    fVar54 = auVar46._4_4_;
    fVar63 = auVar46._8_4_;
    fVar51 = auVar90._0_4_;
    fVar65 = auVar90._4_4_;
    fVar80 = auVar90._8_4_;
    fVar34 = auVar90._12_4_;
    fVar35 = auVar39._0_4_;
    fVar53 = auVar39._4_4_;
    fVar73 = auVar39._8_4_;
    fVar81 = auVar39._12_4_;
    fVar45 = auVar22._0_4_;
    fVar25 = auVar22._4_4_;
    fVar26 = auVar22._8_4_;
    fVar29 = auVar22._12_4_;
    aVar2 = (ray->org).field_0.field_1;
    fVar52 = aVar2.x;
    fVar62 = aVar2.y;
    fVar64 = aVar2.z;
    aVar3 = (ray->dir).field_0.field_1;
    fVar66 = aVar3.x;
    fVar69 = aVar3.y;
    fVar70 = aVar3.z;
    auVar42._0_4_ =
         fVar52 * fVar45 +
         fVar62 * fVar35 + (fVar64 * fVar51 - (fVar71 * fVar45 + fVar54 * fVar35 + fVar63 * fVar51))
    ;
    auVar42._4_4_ =
         fVar52 * fVar25 +
         fVar62 * fVar53 + (fVar64 * fVar65 - (fVar71 * fVar25 + fVar54 * fVar53 + fVar63 * fVar65))
    ;
    auVar42._8_4_ =
         fVar52 * fVar26 +
         fVar62 * fVar73 + (fVar64 * fVar80 - (fVar71 * fVar26 + fVar54 * fVar73 + fVar63 * fVar80))
    ;
    auVar42._12_4_ =
         fVar52 * fVar29 +
         fVar62 * fVar81 + (fVar64 * fVar34 - (fVar71 * fVar29 + fVar54 * fVar81 + fVar63 * fVar34))
    ;
    aVar43.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar42,aVar2,8);
    (ray->org).field_0 = aVar43;
    auVar23._0_4_ = fVar66 * fVar45 + fVar69 * fVar35 + fVar70 * fVar51;
    auVar23._4_4_ = fVar66 * fVar25 + fVar69 * fVar53 + fVar70 * fVar65;
    auVar23._8_4_ = fVar66 * fVar26 + fVar69 * fVar73 + fVar70 * fVar80;
    auVar23._12_4_ = fVar66 * fVar29 + fVar69 * fVar81 + fVar70 * fVar34;
    aVar43.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar23,aVar3,8);
    (ray->dir).field_0 = aVar43;
    (**(code **)&pAVar11->field_0x80)(&(pAVar11->super_AccelData).field_0x58,ray);
    local_198 = aVar2._0_8_;
    uStack_190 = aVar2._8_8_;
    *(undefined8 *)&(ray->org).field_0 = local_198;
    *(undefined8 *)((long)&(ray->org).field_0 + 8) = uStack_190;
    local_188 = aVar3._0_8_;
    uStack_180 = aVar3._8_8_;
    *(undefined8 *)&(ray->dir).field_0 = local_188;
    *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uStack_180;
    bVar10 = ray->tfar <= 0.0 && ray->tfar != 0.0;
    pRVar5->instID[0] = 0xffffffff;
    pRVar5->instPrimID[0] = 0xffffffff;
  }
  return bVar10;
}

Assistant:

bool InstanceArrayIntersector1MB::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);      
      }
      return occluded;
    }